

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O2

void __thiscall MeshLib::SolidDelegate::removeEdge(SolidDelegate *this,Solid *pS,Edge *e)

{
  tVertex __filename;
  tVertex __filename_00;
  
  __filename = Solid::idVertex(pS,(e->key).m_s);
  __filename_00 = Solid::idVertex(pS,(e->key).m_t);
  if ((__filename != (tVertex)0x0) && (__filename->m_halfedge == (HalfEdge *)0x0)) {
    AVL::Tree<MeshLib::Vertex>::remove(&pS->m_verts,(char *)__filename);
    std::__cxx11::string::~string((string *)&__filename->m_string);
    operator_delete(__filename);
  }
  if ((__filename_00 != (tVertex)0x0) && (__filename_00->m_halfedge == (HalfEdge *)0x0)) {
    AVL::Tree<MeshLib::Vertex>::remove(&pS->m_verts,(char *)__filename_00);
    std::__cxx11::string::~string((string *)&__filename_00->m_string);
    operator_delete(__filename_00);
  }
  AVL::Tree<MeshLib::Edge>::remove(&pS->m_edges,(char *)e);
  return;
}

Assistant:

void SolidDelegate::removeEdge( Solid * pS, Edge * e)
{
	Vertex * v1 = pS->idVertex (e->ekey ().s ());
	Vertex * v2 = pS->idVertex (e->ekey ().t ());
	if(v1!= NULL && v1->halfedge () == NULL)
	{
		removeVertex(pS,v1);
		delete v1;
	}
	if(v2 != NULL && v2->halfedge () == NULL)
	{
		removeVertex(pS,v2);
		delete v2;
	}
	pS->m_edges.remove(e);
}